

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManClockDomainNum(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  p_00 = p->vRegClasses;
  if (p_00 == (Vec_Int_t *)0x0) {
    iVar4 = 0;
  }
  else {
    if ((long)p_00->nSize == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *p_00->pArray;
      for (lVar3 = 1; lVar3 < p_00->nSize; lVar3 = lVar3 + 1) {
        iVar4 = p_00->pArray[lVar3];
        if (iVar5 <= iVar4) {
          iVar5 = iVar4;
        }
      }
    }
    iVar4 = 0;
    iVar1 = Vec_IntCountEntry(p_00,0);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntCountEntry(p->vRegClasses, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x50,"int Gia_ManClockDomainNum(Gia_Man_t *)");
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (iVar1 = 1; iVar1 - iVar5 != 1; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntCountEntry(p_00,iVar1);
      iVar4 = iVar4 + (uint)(0 < iVar2);
    }
  }
  return iVar4;
}

Assistant:

int Gia_ManClockDomainNum( Gia_Man_t * p )
{
    int i, nDoms, Count = 0;
    if ( p->vRegClasses == NULL )
        return 0;
    nDoms = Vec_IntFindMax(p->vRegClasses);
    assert( Vec_IntCountEntry(p->vRegClasses, 0) == 0 );
    for ( i = 1; i <= nDoms; i++ )
        if ( Vec_IntCountEntry(p->vRegClasses, i) > 0 )
            Count++;
    return Count;    
}